

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::js::Generator::GenerateOneofCaseDefinition
          (Generator *this,GeneratorOptions *options,Printer *printer,OneofDescriptor *oneof)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  OneofDescriptor *oneof_00;
  FieldDescriptor *field;
  OneofDescriptor *oneof_01;
  OneofDescriptor *oneof_02;
  long lVar2;
  int i;
  long lVar3;
  string local_98;
  string local_78;
  GeneratorOptions *local_58;
  string local_50;
  
  (anonymous_namespace)::GetMessagePath_abi_cxx11_
            (&local_98,(_anonymous_namespace_ *)options,*(GeneratorOptions **)(oneof + 0x10),
             (Descriptor *)oneof);
  (anonymous_namespace)::JSOneofName_abi_cxx11_(&local_78,(_anonymous_namespace_ *)oneof,oneof_00);
  __return_storage_ptr__ = &local_50;
  anon_unknown_0::ToEnumCase(__return_storage_ptr__,*(string **)(oneof + 8));
  local_58 = options;
  io::Printer::
  Print<char[10],std::__cxx11::string,char[6],std::__cxx11::string,char[7],std::__cxx11::string>
            (printer,
             "/**\n * @enum {number}\n */\n$classname$.$oneof$Case = {\n  $upcase$_NOT_SET: 0",
             (char (*) [10])0x3dd2a7,&local_98,(char (*) [6])0x429a77,&local_78,
             (char (*) [7])"upcase",__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  lVar2 = 0;
  for (lVar3 = 0; lVar3 < *(int *)(oneof + 4); lVar3 = lVar3 + 1) {
    bVar1 = anon_unknown_0::IgnoreField((FieldDescriptor *)(*(long *)(oneof + 0x20) + lVar2));
    if (!bVar1) {
      anon_unknown_0::ToEnumCase(&local_98,*(string **)(*(long *)(oneof + 0x20) + 8 + lVar2));
      (anonymous_namespace)::JSFieldIndex_abi_cxx11_
                (&local_78,(_anonymous_namespace_ *)(*(long *)(oneof + 0x20) + lVar2),field);
      __return_storage_ptr__ = &local_98;
      io::Printer::Print<char[7],std::__cxx11::string,char[7],std::__cxx11::string>
                (printer,",\n  $upcase$: $number$",(char (*) [7])"upcase",__return_storage_ptr__,
                 (char (*) [7])0x3f3265,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_98);
      io::Printer::Annotate<google::protobuf::FieldDescriptor>
                (printer,"upcase",(FieldDescriptor *)(*(long *)(oneof + 0x20) + lVar2));
    }
    lVar2 = lVar2 + 0x48;
  }
  (anonymous_namespace)::GetMessagePath_abi_cxx11_
            (&local_98,(_anonymous_namespace_ *)local_58,*(GeneratorOptions **)(oneof + 0x10),
             (Descriptor *)__return_storage_ptr__);
  (anonymous_namespace)::JSOneofName_abi_cxx11_(&local_78,(_anonymous_namespace_ *)oneof,oneof_01);
  (anonymous_namespace)::JSOneofIndex_abi_cxx11_(&local_50,(_anonymous_namespace_ *)oneof,oneof_02);
  io::Printer::
  Print<char[6],std::__cxx11::string,char[6],std::__cxx11::string,char[11],std::__cxx11::string>
            (printer,
             "\n};\n\n/**\n * @return {$class$.$oneof$Case}\n */\n$class$.prototype.get$oneof$Case = function() {\n  return /** @type {$class$.$oneof$Case} */(jspb.Message.computeOneofCase(this, $class$.oneofGroups_[$oneofindex$]));\n};\n\n"
             ,(char (*) [6])0x3dc710,&local_98,(char (*) [6])0x429a77,&local_78,
             (char (*) [11])"oneofindex",&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  return;
}

Assistant:

void Generator::GenerateOneofCaseDefinition(
    const GeneratorOptions& options, io::Printer* printer,
    const OneofDescriptor* oneof) const {
  printer->Print(
      "/**\n"
      " * @enum {number}\n"
      " */\n"
      "$classname$.$oneof$Case = {\n"
      "  $upcase$_NOT_SET: 0",
      "classname", GetMessagePath(options, oneof->containing_type()), "oneof",
      JSOneofName(oneof), "upcase", ToEnumCase(oneof->name()));

  for (int i = 0; i < oneof->field_count(); i++) {
    if (IgnoreField(oneof->field(i))) {
      continue;
    }

    printer->Print(
        ",\n"
        "  $upcase$: $number$",
        "upcase", ToEnumCase(oneof->field(i)->name()), "number",
        JSFieldIndex(oneof->field(i)));
    printer->Annotate("upcase", oneof->field(i));
  }

  printer->Print(
      "\n"
      "};\n"
      "\n"
      "/**\n"
      " * @return {$class$.$oneof$Case}\n"
      " */\n"
      "$class$.prototype.get$oneof$Case = function() {\n"
      "  return /** @type {$class$.$oneof$Case} */(jspb.Message."
      "computeOneofCase(this, $class$.oneofGroups_[$oneofindex$]));\n"
      "};\n"
      "\n",
      "class", GetMessagePath(options, oneof->containing_type()), "oneof",
      JSOneofName(oneof), "oneofindex", JSOneofIndex(oneof));
}